

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

Complex __thiscall libDAI::KL_dist<double>(libDAI *this,TFactor<double> *P,TFactor<double> *Q)

{
  pointer pVVar1;
  Complex CVar2;
  
  pVVar1 = *(pointer *)(this + 8);
  if ((pVVar1 != *(pointer *)this) &&
     (pVVar1 = (P->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pVVar1 != (P->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_start)) {
    CVar2 = KL_dist((TProb<double> *)(this + 0x20),&P->_p);
    Q = CVar2._M_value._8_8_;
    pVVar1 = CVar2._M_value._0_8_;
  }
  CVar2._M_value._8_8_ = Q;
  CVar2._M_value._0_8_ = pVVar1;
  return (Complex)CVar2._M_value;
}

Assistant:

Complex KL_dist(const TFactor<T> & P, const TFactor<T> & Q) {
        if( P._vs.empty() || Q._vs.empty() )
            return -1;
        else {
#ifdef DEBUG
            assert( P._vs == Q._vs );
#endif
            return KL_dist( P._p, Q._p );
        }
    }